

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void units::addUserDefinedUnit(string *name,precise_unit *un)

{
  uint32_t uVar1;
  precise_unit *ppVar2;
  bool bVar3;
  mapped_type *this;
  mapped_type *pmVar4;
  unit local_20;
  precise_unit *local_18;
  precise_unit *un_local;
  string *name_local;
  
  local_18 = un;
  un_local = (precise_unit *)name;
  bVar3 = std::atomic<bool>::load((atomic<bool> *)&allowUserDefinedUnits,memory_order_acquire);
  ppVar2 = un_local;
  if (bVar3) {
    local_20 = unit_cast(local_18);
    this = std::
           unordered_map<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<units::unit>,_std::equal_to<units::unit>,_std::allocator<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((unordered_map<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<units::unit>,_std::equal_to<units::unit>,_std::allocator<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)user_defined_unit_names_abi_cxx11_,&local_20);
    std::__cxx11::string::operator=((string *)this,(string *)ppVar2);
    ppVar2 = local_18;
    pmVar4 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>_>
             ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>_>
                           *)user_defined_units_abi_cxx11_,(key_type *)un_local);
    pmVar4->multiplier_ = ppVar2->multiplier_;
    uVar1 = ppVar2->commodity_;
    pmVar4->base_units_ = ppVar2->base_units_;
    pmVar4->commodity_ = uVar1;
    bVar3 = std::atomic<bool>::load((atomic<bool> *)&allowUserDefinedUnits,memory_order_acquire);
    std::atomic<bool>::store((atomic<bool> *)&allowUserDefinedUnits,bVar3,memory_order_release);
  }
  return;
}

Assistant:

void addUserDefinedUnit(const std::string& name, const precise_unit& un)
{
    if (allowUserDefinedUnits.load(std::memory_order_acquire)) {
        user_defined_unit_names[unit_cast(un)] = name;
        user_defined_units[name] = un;
        allowUserDefinedUnits.store(
            allowUserDefinedUnits.load(std::memory_order_acquire),
            std::memory_order_release);
    }
}